

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

RPCHelpMan * getpeerinfo(void)

{
  size_type *psVar1;
  ulong *puVar2;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string m_key_name_12;
  string m_key_name_13;
  string m_key_name_14;
  string m_key_name_15;
  string m_key_name_16;
  string m_key_name_17;
  string m_key_name_18;
  string m_key_name_19;
  string m_key_name_20;
  string m_key_name_21;
  string m_key_name_22;
  string m_key_name_23;
  string m_key_name_24;
  string m_key_name_25;
  string m_key_name_26;
  string m_key_name_27;
  string m_key_name_28;
  string m_key_name_29;
  string m_key_name_30;
  string m_key_name_31;
  string m_key_name_32;
  string m_key_name_33;
  string m_key_name_34;
  string m_key_name_35;
  string m_key_name_36;
  string m_key_name_37;
  string m_key_name_38;
  string m_key_name_39;
  string name;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string description_19;
  string description_20;
  string description_21;
  string description_22;
  string description_23;
  string description_24;
  string description_25;
  string description_26;
  string description_27;
  string description_28;
  string description_29;
  string description_30;
  string description_31;
  string description_32;
  string description_33;
  string description_34;
  string description_35;
  string description_36;
  string description_37;
  string description_38;
  string description_39;
  string description_40;
  string description_41;
  string description_42;
  string description_43;
  string description_44;
  string description_45;
  string description_46;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_19;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_20;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_21;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_22;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_23;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_24;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_25;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_26;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_27;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_28;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_29;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_30;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_31;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_32;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_33;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_34;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_35;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_36;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_37;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_38;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_39;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_40;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_41;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_42;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_43;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_44;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_45;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  RPCHelpMan *in_RDI;
  undefined8 uVar12;
  long lVar13;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  undefined4 in_stack_ffffffffffffd218;
  undefined4 uVar14;
  undefined4 in_stack_ffffffffffffd21c;
  undefined1 in_stack_ffffffffffffd220 [16];
  undefined8 in_stack_ffffffffffffd238;
  undefined8 in_stack_ffffffffffffd240;
  undefined8 in_stack_ffffffffffffd248;
  code *pcVar15;
  undefined8 in_stack_ffffffffffffd250;
  undefined1 in_stack_ffffffffffffd258 [16];
  pointer in_stack_ffffffffffffd268;
  pointer pRVar16;
  pointer pRVar17;
  pointer pRVar18;
  pointer in_stack_ffffffffffffd280;
  pointer pRVar19;
  pointer pRVar20;
  pointer pRVar21;
  undefined8 in_stack_ffffffffffffd2a0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2d58;
  allocator_type local_2d39;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2d38;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2d18;
  allocator_type local_2cf9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2cf8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2ce0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2cc8;
  allocator_type local_2ca9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2ca8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2c90;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2c78;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2c58;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2c38;
  allocator_type local_2c19;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2c18;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2c00;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2be8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2bc8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2ba8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b88;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b68;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b48;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b28;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b08;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2ae8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2ac8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2aa8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a88;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a68;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a48;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a28;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a08;
  vector<RPCResult,_std::allocator<RPCResult>_> local_29e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_29c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_29a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2988;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2968;
  allocator_type local_2949;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2948;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2930;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2918;
  vector<RPCResult,_std::allocator<RPCResult>_> local_28f8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_28d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28c0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_28a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2888;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2868;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2848;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2830;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2818;
  RPCResults local_2800;
  vector<RPCArg,_std::allocator<RPCArg>_> local_27e8;
  string local_27d0;
  string local_27b0;
  string local_2790;
  string local_2770;
  string local_2750;
  string local_2730;
  ulong *local_2710;
  undefined8 local_2708;
  ulong local_2700;
  undefined8 uStack_26f8;
  ulong *local_26f0;
  size_type local_26e8;
  ulong local_26e0;
  undefined8 uStack_26d8;
  long *local_26d0 [2];
  long local_26c0 [2];
  long *local_26b0 [2];
  long local_26a0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2670;
  size_type *local_2650;
  size_type local_2648;
  size_type local_2640;
  undefined8 uStack_2638;
  long *local_2630 [2];
  long local_2620 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25f0;
  size_type *local_25d0;
  size_type local_25c8;
  size_type local_25c0;
  undefined8 uStack_25b8;
  long *local_25b0 [2];
  long local_25a0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2590;
  size_type *local_2570;
  size_type local_2568;
  size_type local_2560;
  undefined8 uStack_2558;
  long *local_2550 [2];
  long local_2540 [2];
  RPCResult local_2530;
  long *local_24a8 [2];
  long local_2498 [2];
  long *local_2488 [2];
  long local_2478 [2];
  long *local_2468 [2];
  long local_2458 [2];
  long *local_2448 [2];
  long local_2438 [2];
  RPCResult local_2428;
  long *local_23a0 [2];
  long local_2390 [2];
  long *local_2380 [2];
  long local_2370 [2];
  long *local_2360 [2];
  long local_2350 [2];
  long *local_2340 [2];
  long local_2330 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2320;
  size_type *local_2300;
  size_type local_22f8;
  size_type local_22f0;
  undefined8 uStack_22e8;
  long *local_22e0 [2];
  long local_22d0 [2];
  RPCResult local_22c0;
  long *local_2238 [2];
  long local_2228 [2];
  long *local_2218 [2];
  long local_2208 [2];
  long *local_21f8 [2];
  long local_21e8 [2];
  long *local_21d8 [2];
  long local_21c8 [2];
  long *local_21b8 [2];
  long local_21a8 [2];
  long *local_2198 [2];
  long local_2188 [2];
  long *local_2178 [2];
  long local_2168 [2];
  long *local_2158 [2];
  long local_2148 [2];
  long *local_2138 [2];
  long local_2128 [2];
  long *local_2118 [2];
  long local_2108 [2];
  RPCResult local_20f8;
  long *local_2070 [2];
  long local_2060 [2];
  long *local_2050 [2];
  long local_2040 [2];
  long *local_2030 [2];
  long local_2020 [2];
  long *local_2010 [2];
  long local_2000 [2];
  long *local_1ff0 [2];
  long local_1fe0 [2];
  long *local_1fd0 [2];
  long local_1fc0 [2];
  long *local_1fb0 [2];
  long local_1fa0 [2];
  long *local_1f90 [2];
  long local_1f80 [2];
  long *local_1f70 [2];
  long local_1f60 [2];
  long *local_1f50 [2];
  long local_1f40 [2];
  long *local_1f30 [2];
  long local_1f20 [2];
  long *local_1f10 [2];
  long local_1f00 [2];
  long *local_1ef0 [2];
  long local_1ee0 [2];
  long *local_1ed0 [2];
  long local_1ec0 [2];
  long *local_1eb0 [2];
  long local_1ea0 [2];
  long *local_1e90 [2];
  long local_1e80 [2];
  long *local_1e70 [2];
  long local_1e60 [2];
  long *local_1e50 [2];
  long local_1e40 [2];
  long *local_1e30 [2];
  long local_1e20 [2];
  long *local_1e10 [2];
  long local_1e00 [2];
  long *local_1df0 [2];
  long local_1de0 [2];
  long *local_1dd0 [2];
  long local_1dc0 [2];
  long *local_1db0 [2];
  long local_1da0 [2];
  long *local_1d90 [2];
  long local_1d80 [2];
  long *local_1d70 [2];
  long local_1d60 [2];
  long *local_1d50 [2];
  long local_1d40 [2];
  long *local_1d30 [2];
  long local_1d20 [2];
  long *local_1d10 [2];
  long local_1d00 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1cf0;
  size_type *local_1cd0;
  size_type local_1cc8;
  size_type local_1cc0;
  undefined8 uStack_1cb8;
  long *local_1cb0 [2];
  long local_1ca0 [2];
  long *local_1c90 [2];
  long local_1c80 [2];
  long *local_1c70 [2];
  long local_1c60 [2];
  long *local_1c50 [2];
  long local_1c40 [2];
  long *local_1c30 [2];
  long local_1c20 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c10;
  size_type *local_1bf0;
  size_type local_1be8;
  size_type local_1be0;
  undefined8 uStack_1bd8;
  long *local_1bd0 [2];
  long local_1bc0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1bb0;
  size_type *local_1b90;
  size_type local_1b88;
  size_type local_1b80;
  undefined8 uStack_1b78;
  long *local_1b70 [2];
  long local_1b60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b50;
  size_type *local_1b30;
  size_type local_1b28;
  size_type local_1b20;
  undefined8 uStack_1b18;
  long *local_1b10 [2];
  long local_1b00 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1af0;
  size_type *local_1ad0;
  size_type local_1ac8;
  size_type local_1ac0;
  undefined8 uStack_1ab8;
  long *local_1ab0 [2];
  long local_1aa0 [2];
  long *local_1a90 [2];
  long local_1a80 [2];
  long *local_1a70 [2];
  long local_1a60 [2];
  long *local_1a50 [2];
  long local_1a40 [2];
  long *local_1a30 [2];
  long local_1a20 [2];
  RPCResult local_1a10;
  long *local_1988 [2];
  long local_1978 [2];
  long *local_1968 [2];
  long local_1958 [2];
  long *local_1948 [2];
  long local_1938 [2];
  long *local_1928 [2];
  long local_1918 [2];
  long *local_1908 [2];
  long local_18f8 [2];
  long *local_18e8 [2];
  long local_18d8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18a8;
  size_type *local_1888;
  size_type local_1880;
  size_type local_1878;
  undefined8 uStack_1870;
  long *local_1868 [2];
  long local_1858 [2];
  long *local_1848 [2];
  long local_1838 [2];
  long *local_1828 [2];
  long local_1818 [2];
  long *local_1808 [2];
  long local_17f8 [2];
  long *local_17e8 [2];
  long local_17d8 [2];
  long *local_17c8 [2];
  long local_17b8 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_17a8;
  long *local_1788 [2];
  long local_1778 [2];
  pointer local_1768 [2];
  undefined1 local_1758 [152];
  RPCResult local_16c0;
  RPCResult local_1638;
  RPCResult local_15b0;
  RPCResult local_1528;
  RPCResult local_14a0;
  RPCResult local_1418;
  RPCResult local_1390;
  RPCResult local_1308;
  RPCResult local_1280;
  RPCResult local_11f8;
  RPCResult local_1170;
  RPCResult local_10e8;
  RPCResult local_1060;
  RPCResult local_fd8;
  RPCResult local_f50;
  RPCResult local_ec8;
  RPCResult local_e40;
  RPCResult local_db8;
  RPCResult local_d30;
  RPCResult local_ca8;
  RPCResult local_c20;
  RPCResult local_b98;
  RPCResult local_b10;
  RPCResult local_a88;
  RPCResult local_a00;
  RPCResult local_978;
  RPCResult local_8f0;
  RPCResult local_868;
  RPCResult local_7e0;
  RPCResult local_758;
  RPCResult local_6d0;
  RPCResult local_648;
  RPCResult local_5c0;
  RPCResult local_538;
  RPCResult local_4b0;
  RPCResult local_428;
  RPCResult local_3a0;
  RPCResult local_318;
  RPCResult local_290;
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  RPCResult local_1c8;
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  RPCResult local_100;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1060.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2030[0] = (long *)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getpeerinfo","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "Returns data about each connected network peer as a json array of objects.","");
  local_120[0] = local_110;
  local_27e8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_27e8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_27e8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"");
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"");
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"");
  local_1768[0] = (pointer)local_1758;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1768,"id","");
  local_1788[0] = local_1778;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1788,"Peer index","");
  local_2848.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2848.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2848.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffd218;
  m_key_name._8_16_ = in_stack_ffffffffffffd220;
  m_key_name.field_2._8_8_ = in_RDI;
  description._M_string_length = in_stack_ffffffffffffd240;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffd268;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)(local_1758 + 0x10),NUM,m_key_name,description,inner,SUB81(local_1768,0));
  local_17a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_17a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_17a8,"addr","");
  local_17c8[0] = local_17b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17c8,"(host:port) The IP address and port of the peer","");
  local_2868.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2868.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2868.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffd218;
  m_key_name_00._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_00.field_2._8_8_ = in_RDI;
  description_00._M_string_length = in_stack_ffffffffffffd240;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_00.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_00.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_16c0,STR,m_key_name_00,description_00,inner_00,SUB81(&local_17a8,0));
  local_17e8[0] = local_17d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_17e8,"addrbind","");
  local_1808[0] = local_17f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1808,"(ip:port) Bind address of the connection to the peer","");
  local_2888.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2888.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2888.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar3._4_16_ = in_stack_ffffffffffffd220;
  auVar3._0_4_ = in_stack_ffffffffffffd21c;
  auVar3._20_8_ = in_RDI;
  auVar3._28_4_ = 0;
  description_01._M_string_length = in_stack_ffffffffffffd240;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_01.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_01.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult
            (&local_1638,STR,(string)(auVar3 << 0x20),SUB81(local_17e8,0),description_01,inner_01,
             true);
  local_1828[0] = local_1818;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1828,"addrlocal","");
  local_1848[0] = local_1838;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1848,"(ip:port) Local address as reported by the peer","");
  local_28a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar14 = 0;
  auVar4._4_16_ = in_stack_ffffffffffffd220;
  auVar4._0_4_ = in_stack_ffffffffffffd21c;
  auVar4._20_8_ = in_RDI;
  auVar4._28_4_ = 0;
  description_02._M_string_length = in_stack_ffffffffffffd240;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_02.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_02.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult
            (&local_15b0,STR,(string)(auVar4 << 0x20),SUB81(local_1828,0),description_02,inner_02,
             true);
  local_1868[0] = local_1858;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1868,"network","");
  GetNetworkNames_abi_cxx11_(&local_28c0,true);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_18c8,(util *)&local_28c0,", ");
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_18c8,0,0,"Network (",9);
  local_18a8._M_dataplus._M_p = (pointer)&local_18a8.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar10 = &pbVar9->field_2;
  if (paVar11 == paVar10) {
    local_18a8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_18a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_18a8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_18a8._M_dataplus._M_p = (pointer)paVar11;
  }
  local_18a8._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_18a8,")");
  local_1888 = &local_1878;
  psVar1 = (size_type *)(pbVar9->_M_dataplus)._M_p;
  paVar11 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar11) {
    local_1878 = paVar11->_M_allocated_capacity;
    uStack_1870 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_1878 = paVar11->_M_allocated_capacity;
    local_1888 = psVar1;
  }
  local_1880 = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  local_28d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_01._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_01.field_2._8_8_ = in_RDI;
  description_03._M_string_length = in_stack_ffffffffffffd240;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_03.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_03.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_1528,STR,m_key_name_01,description_03,inner_03,SUB81(local_1868,0));
  local_18e8[0] = local_18d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_18e8,"mapped_as","");
  local_1908[0] = local_18f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1908,
             "The AS in the BGP route to the peer used for diversifying\npeer selection (only available if the asmap config flag is set)"
             ,"");
  local_28f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar14 = 0;
  auVar5._4_16_ = in_stack_ffffffffffffd220;
  auVar5._0_4_ = in_stack_ffffffffffffd21c;
  auVar5._20_8_ = in_RDI;
  auVar5._28_4_ = 0;
  description_04._M_string_length = in_stack_ffffffffffffd240;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_04.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_04.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult
            (&local_14a0,NUM,(string)(auVar5 << 0x20),SUB81(local_18e8,0),description_04,inner_04,
             true);
  local_1928[0] = local_1918;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1928,"services","");
  local_1948[0] = local_1938;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1948,"The services offered","");
  local_2918.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2918.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2918.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_02._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_02.field_2._8_8_ = in_RDI;
  description_05._M_string_length = in_stack_ffffffffffffd240;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_05.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_05.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult
            (&local_1418,STR_HEX,m_key_name_02,description_05,inner_05,SUB81(local_1928,0));
  local_1968[0] = local_1958;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1968,"servicesnames","");
  local_1988[0] = local_1978;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1988,"the services offered, in human-readable form","");
  local_1a30[0] = local_1a20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a30,"SERVICE_NAME","");
  local_1a50[0] = local_1a40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a50,"the service name if it is recognised","");
  local_2948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_03._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_03.field_2._8_8_ = in_RDI;
  description_06._M_string_length = in_stack_ffffffffffffd240;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_06.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_06.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_1a10,STR,m_key_name_03,description_06,inner_06,SUB81(local_1a30,0));
  __l._M_len = 1;
  __l._M_array = &local_1a10;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_2930,__l,&local_2949);
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_04._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_04.field_2._8_8_ = in_RDI;
  description_07._M_string_length = in_stack_ffffffffffffd240;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_07.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_07.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_1390,ARR,m_key_name_04,description_07,inner_07,SUB81(local_1968,0));
  local_1a70[0] = local_1a60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a70,"relaytxes","");
  local_1a90[0] = local_1a80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a90,"Whether we relay transactions to this peer","");
  local_2968.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2968.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2968.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_05._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_05.field_2._8_8_ = in_RDI;
  description_08._M_string_length = in_stack_ffffffffffffd240;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_08.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_08.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_1308,BOOL,m_key_name_05,description_08,inner_08,SUB81(local_1a70,0));
  local_1ab0[0] = local_1aa0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1ab0,"lastsend","");
  std::operator+(&local_1af0,"The ",&UNIX_EPOCH_TIME_abi_cxx11_);
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1af0," of the last send");
  local_1ad0 = &local_1ac0;
  psVar1 = (size_type *)(pbVar9->_M_dataplus)._M_p;
  paVar11 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar11) {
    local_1ac0 = paVar11->_M_allocated_capacity;
    uStack_1ab8 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_1ac0 = paVar11->_M_allocated_capacity;
    local_1ad0 = psVar1;
  }
  local_1ac8 = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  local_2988.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2988.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2988.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_06._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_06.field_2._8_8_ = in_RDI;
  description_09._M_string_length = in_stack_ffffffffffffd240;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_09.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_09.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult
            (&local_1280,NUM_TIME,m_key_name_06,description_09,inner_09,SUB81(local_1ab0,0));
  local_1b10[0] = local_1b00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b10,"lastrecv","");
  std::operator+(&local_1b50,"The ",&UNIX_EPOCH_TIME_abi_cxx11_);
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1b50," of the last receive");
  local_1b30 = &local_1b20;
  psVar1 = (size_type *)(pbVar9->_M_dataplus)._M_p;
  paVar11 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar11) {
    local_1b20 = paVar11->_M_allocated_capacity;
    uStack_1b18 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_1b20 = paVar11->_M_allocated_capacity;
    local_1b30 = psVar1;
  }
  local_1b28 = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  local_29a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_29a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_29a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_07._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_07.field_2._8_8_ = in_RDI;
  description_10._M_string_length = in_stack_ffffffffffffd240;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_10.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_10.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult
            (&local_11f8,NUM_TIME,m_key_name_07,description_10,inner_10,SUB81(local_1b10,0));
  local_1b70[0] = local_1b60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b70,"last_transaction","");
  std::operator+(&local_1bb0,"The ",&UNIX_EPOCH_TIME_abi_cxx11_);
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1bb0," of the last valid transaction received from this peer");
  local_1b90 = &local_1b80;
  psVar1 = (size_type *)(pbVar9->_M_dataplus)._M_p;
  paVar11 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar11) {
    local_1b80 = paVar11->_M_allocated_capacity;
    uStack_1b78 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_1b80 = paVar11->_M_allocated_capacity;
    local_1b90 = psVar1;
  }
  local_1b88 = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  local_29c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_29c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_29c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_08._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_08.field_2._8_8_ = in_RDI;
  description_11._M_string_length = in_stack_ffffffffffffd240;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_11.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_11.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult
            (&local_1170,NUM_TIME,m_key_name_08,description_11,inner_11,SUB81(local_1b70,0));
  local_1bd0[0] = local_1bc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1bd0,"last_block","");
  std::operator+(&local_1c10,"The ",&UNIX_EPOCH_TIME_abi_cxx11_);
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1c10," of the last block received from this peer");
  local_1bf0 = &local_1be0;
  psVar1 = (size_type *)(pbVar9->_M_dataplus)._M_p;
  paVar11 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar11) {
    local_1be0 = paVar11->_M_allocated_capacity;
    uStack_1bd8 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_1be0 = paVar11->_M_allocated_capacity;
    local_1bf0 = psVar1;
  }
  local_1be8 = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  local_29e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_29e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_29e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_09._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_09._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_09.field_2._8_8_ = in_RDI;
  description_12._M_string_length = in_stack_ffffffffffffd240;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_12.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_12.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult
            (&local_10e8,NUM_TIME,m_key_name_09,description_12,inner_12,SUB81(local_1bd0,0));
  local_1c30[0] = local_1c20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c30,"bytessent","");
  local_1c50[0] = local_1c40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c50,"The total bytes sent","");
  local_2a08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_10._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_10._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_10._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_10.field_2._8_8_ = in_RDI;
  description_13._M_string_length = in_stack_ffffffffffffd240;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_13.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_13.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_1060,NUM,m_key_name_10,description_13,inner_13,SUB81(local_1c30,0));
  local_1c70[0] = local_1c60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c70,"bytesrecv","");
  local_1c90[0] = local_1c80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c90,"The total bytes received","");
  local_2a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_11._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_11._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_11._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_11.field_2._8_8_ = in_RDI;
  description_14._M_string_length = in_stack_ffffffffffffd240;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_14.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_14.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_fd8,NUM,m_key_name_11,description_14,inner_14,SUB81(local_1c70,0));
  local_1cb0[0] = local_1ca0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1cb0,"conntime","");
  std::operator+(&local_1cf0,"The ",&UNIX_EPOCH_TIME_abi_cxx11_);
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1cf0," of the connection");
  local_1cd0 = &local_1cc0;
  psVar1 = (size_type *)(pbVar9->_M_dataplus)._M_p;
  paVar11 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar11) {
    local_1cc0 = paVar11->_M_allocated_capacity;
    uStack_1cb8 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_1cc0 = paVar11->_M_allocated_capacity;
    local_1cd0 = psVar1;
  }
  local_1cc8 = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  local_2a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_12._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_12._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_12._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_12.field_2._8_8_ = in_RDI;
  description_15._M_string_length = in_stack_ffffffffffffd240;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_15.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_15.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult
            (&local_f50,NUM_TIME,m_key_name_12,description_15,inner_15,SUB81(local_1cb0,0));
  local_1d10[0] = local_1d00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d10,"timeoffset","");
  local_1d30[0] = local_1d20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d30,"The time offset in seconds","");
  local_2a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_13._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_13._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_13._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_13.field_2._8_8_ = in_RDI;
  description_16._M_string_length = in_stack_ffffffffffffd240;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_16.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_16.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_ec8,NUM,m_key_name_13,description_16,inner_16,SUB81(local_1d10,0));
  local_1d50[0] = local_1d40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d50,"pingtime","");
  local_1d70[0] = local_1d60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d70,"The last ping time in milliseconds (ms), if any","");
  local_2a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar6._4_16_ = in_stack_ffffffffffffd220;
  auVar6._0_4_ = in_stack_ffffffffffffd21c;
  auVar6._20_8_ = in_RDI;
  auVar6._28_4_ = 0;
  description_17._M_string_length = in_stack_ffffffffffffd240;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_17.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_17.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult
            (&local_e40,NUM,(string)(auVar6 << 0x20),SUB81(local_1d50,0),description_17,inner_17,
             true);
  local_1d90[0] = local_1d80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d90,"minping","");
  local_1db0[0] = local_1da0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1db0,"The minimum observed ping time in milliseconds (ms), if any","");
  local_2aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar7._4_16_ = in_stack_ffffffffffffd220;
  auVar7._0_4_ = in_stack_ffffffffffffd21c;
  auVar7._20_8_ = in_RDI;
  auVar7._28_4_ = 0;
  description_18._M_string_length = in_stack_ffffffffffffd240;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_18.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_18.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult
            (&local_db8,NUM,(string)(auVar7 << 0x20),SUB81(local_1d90,0),description_18,inner_18,
             true);
  local_1dd0[0] = local_1dc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1dd0,"pingwait","");
  local_1df0[0] = local_1de0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1df0,
             "The duration in milliseconds (ms) of an outstanding ping (if non-zero)","");
  local_2ac8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2ac8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2ac8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar14 = 0;
  auVar8._4_16_ = in_stack_ffffffffffffd220;
  auVar8._0_4_ = in_stack_ffffffffffffd21c;
  auVar8._20_8_ = in_RDI;
  auVar8._28_4_ = 0;
  description_19._M_string_length = in_stack_ffffffffffffd240;
  description_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_19.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_19.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult
            (&local_d30,NUM,(string)(auVar8 << 0x20),SUB81(local_1dd0,0),description_19,inner_19,
             true);
  local_1e10[0] = local_1e00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e10,"version","");
  local_1e30[0] = local_1e20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e30,"The peer version, such as 70001","");
  local_2ae8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2ae8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2ae8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_14._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_14._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_14._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_14.field_2._8_8_ = in_RDI;
  description_20._M_string_length = in_stack_ffffffffffffd240;
  description_20._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_20.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_20.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_ca8,NUM,m_key_name_14,description_20,inner_20,SUB81(local_1e10,0));
  local_1e50[0] = local_1e40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e50,"subver","");
  local_1e70[0] = local_1e60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e70,"The string version","");
  local_2b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_15._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_15._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_15._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_15.field_2._8_8_ = in_RDI;
  description_21._M_string_length = in_stack_ffffffffffffd240;
  description_21._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_21.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_21.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_c20,STR,m_key_name_15,description_21,inner_21,SUB81(local_1e50,0));
  local_1e90[0] = local_1e80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e90,"inbound","");
  local_1eb0[0] = local_1ea0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1eb0,"Inbound (true) or Outbound (false)","");
  local_2b28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_16._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_16._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_16._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_16.field_2._8_8_ = in_RDI;
  description_22._M_string_length = in_stack_ffffffffffffd240;
  description_22._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_22.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_22.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_b98,BOOL,m_key_name_16,description_22,inner_22,SUB81(local_1e90,0));
  local_1ed0[0] = local_1ec0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1ed0,"bip152_hb_to","");
  local_1ef0[0] = local_1ee0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ef0,"Whether we selected peer as (compact blocks) high-bandwidth peer"
             ,"");
  local_2b48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_17._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_17._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_17._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_17.field_2._8_8_ = in_RDI;
  description_23._M_string_length = in_stack_ffffffffffffd240;
  description_23._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_23.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_23.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_b10,BOOL,m_key_name_17,description_23,inner_23,SUB81(local_1ed0,0));
  local_1f10[0] = local_1f00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f10,"bip152_hb_from","");
  local_1f30[0] = local_1f20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f30,"Whether peer selected us as (compact blocks) high-bandwidth peer"
             ,"");
  local_2b68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_18._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_18._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_18._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_18.field_2._8_8_ = in_RDI;
  description_24._M_string_length = in_stack_ffffffffffffd240;
  description_24._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_24.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_24.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_a88,BOOL,m_key_name_18,description_24,inner_24,SUB81(local_1f10,0));
  local_1f50[0] = local_1f40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f50,"startingheight","");
  local_1f70[0] = local_1f60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f70,"The starting height (block) of the peer","");
  local_2b88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_19._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_19._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_19._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_19.field_2._8_8_ = in_RDI;
  description_25._M_string_length = in_stack_ffffffffffffd240;
  description_25._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_25.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_25.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_a00,NUM,m_key_name_19,description_25,inner_25,SUB81(local_1f50,0));
  local_1f90[0] = local_1f80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f90,"presynced_headers","");
  local_1fb0[0] = local_1fa0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1fb0,
             "The current height of header pre-synchronization with this peer, or -1 if no low-work sync is in progress"
             ,"");
  local_2ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_20._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_20._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_20._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_20.field_2._8_8_ = in_RDI;
  description_26._M_string_length = in_stack_ffffffffffffd240;
  description_26._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_26.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_26.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_978,NUM,m_key_name_20,description_26,inner_26,SUB81(local_1f90,0));
  local_1fd0[0] = local_1fc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1fd0,"synced_headers","");
  local_1ff0[0] = local_1fe0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ff0,"The last header we have in common with this peer","");
  local_2bc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2bc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2bc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_21._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_21._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_21._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_21.field_2._8_8_ = in_RDI;
  description_27._M_string_length = in_stack_ffffffffffffd240;
  description_27._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_27.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_27.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_8f0,NUM,m_key_name_21,description_27,inner_27,SUB81(local_1fd0,0));
  local_2010[0] = local_2000;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2010,"synced_blocks","");
  local_2030[0] = local_2020;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2030,"The last block we have in common with this peer","");
  local_2be8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2be8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2be8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_22._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_22._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_22._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_22.field_2._8_8_ = in_RDI;
  description_28._M_string_length = in_stack_ffffffffffffd240;
  description_28._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_28.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_28.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_868,NUM,m_key_name_22,description_28,inner_28,SUB81(local_2010,0));
  local_2050[0] = local_2040;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2050,"inflight","");
  local_2070[0] = local_2060;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2070,"");
  local_2118[0] = local_2108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2118,"n","");
  local_2138[0] = local_2128;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2138,"The heights of blocks we\'re currently asking from this peer","")
  ;
  local_2c18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_23._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_23._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_23._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_23.field_2._8_8_ = in_RDI;
  description_29._M_string_length = in_stack_ffffffffffffd240;
  description_29._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_29.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_29.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_20f8,NUM,m_key_name_23,description_29,inner_29,SUB81(local_2118,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_20f8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_2c00,__l_00,&local_2c19);
  m_key_name_24._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_24._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_24._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_24.field_2._8_8_ = in_RDI;
  description_30._M_string_length = in_stack_ffffffffffffd240;
  description_30._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_30.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_30.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_7e0,ARR,m_key_name_24,description_30,inner_30,SUB81(local_2050,0));
  local_2158[0] = local_2148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2158,"addr_relay_enabled","");
  local_2178[0] = local_2168;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2178,"Whether we participate in address relay with this peer","");
  local_2c38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_25._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_25._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_25._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_25.field_2._8_8_ = in_RDI;
  description_31._M_string_length = in_stack_ffffffffffffd240;
  description_31._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_31.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_31.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_31.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_31.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_31.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_758,BOOL,m_key_name_25,description_31,inner_31,SUB81(local_2158,0));
  local_2198[0] = local_2188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2198,"addr_processed","");
  local_21b8[0] = local_21a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_21b8,
             "The total number of addresses processed, excluding those dropped due to rate limiting"
             ,"");
  local_2c58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_26._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_26._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_26._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_26.field_2._8_8_ = in_RDI;
  description_32._M_string_length = in_stack_ffffffffffffd240;
  description_32._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_32.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_32.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_32.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_32.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_32.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_6d0,NUM,m_key_name_26,description_32,inner_32,SUB81(local_2198,0));
  local_21d8[0] = local_21c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_21d8,"addr_rate_limited","");
  local_21f8[0] = local_21e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_21f8,"The total number of addresses dropped due to rate limiting","");
  local_2c78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_27._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_27._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_27._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_27.field_2._8_8_ = in_RDI;
  description_33._M_string_length = in_stack_ffffffffffffd240;
  description_33._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_33.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_33.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_33.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_33.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_33.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_648,NUM,m_key_name_27,description_33,inner_33,SUB81(local_21d8,0));
  local_2218[0] = local_2208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2218,"permissions","");
  local_2238[0] = local_2228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2238,"Any special permissions that have been granted to this peer","");
  local_22e0[0] = local_22d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_22e0,"permission_type","");
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_2320,(util *)&NET_PERMISSIONS_DOC_abi_cxx11_,",\n");
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2320,".\n");
  local_2300 = &local_22f0;
  psVar1 = (size_type *)(pbVar9->_M_dataplus)._M_p;
  paVar11 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar11) {
    local_22f0 = paVar11->_M_allocated_capacity;
    uStack_22e8 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_22f0 = paVar11->_M_allocated_capacity;
    local_2300 = psVar1;
  }
  local_22f8 = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  local_2ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_28._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_28._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_28._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_28.field_2._8_8_ = in_RDI;
  description_34._M_string_length = in_stack_ffffffffffffd240;
  description_34._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_34.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_34.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_34.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_34.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_34.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_22c0,STR,m_key_name_28,description_34,inner_34,SUB81(local_22e0,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_22c0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_2c90,__l_01,&local_2ca9);
  m_key_name_29._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_29._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_29._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_29.field_2._8_8_ = in_RDI;
  description_35._M_string_length = in_stack_ffffffffffffd240;
  description_35._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_35.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_35.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_35.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_35.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_35.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_5c0,ARR,m_key_name_29,description_35,inner_35,SUB81(local_2218,0));
  local_2340[0] = local_2330;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2340,"minfeefilter","");
  local_2360[0] = local_2350;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2360,"The minimum fee rate for transactions this peer accepts","");
  local_2cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_30._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_30._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_30._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_30.field_2._8_8_ = in_RDI;
  description_36._M_string_length = in_stack_ffffffffffffd240;
  description_36._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_36.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_36.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_36.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_36.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_36.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_538,NUM,m_key_name_30,description_36,inner_36,SUB81(local_2340,0));
  local_2380[0] = local_2370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2380,"bytessent_per_msg","");
  local_23a0[0] = local_2390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_23a0,"");
  local_2448[0] = local_2438;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2448,"msg","");
  local_2468[0] = local_2458;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2468,
             "The total bytes sent aggregated by message type\nWhen a message type is not listed in this json object, the bytes sent are 0.\nOnly known message types can appear as keys in the object."
             ,"");
  local_2cf8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2cf8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2cf8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_31._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_31._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_31._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_31.field_2._8_8_ = in_RDI;
  description_37._M_string_length = in_stack_ffffffffffffd240;
  description_37._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_37.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_37.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_37.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_37.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_37.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_2428,NUM,m_key_name_31,description_37,inner_37,SUB81(local_2448,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_2428;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_2ce0,__l_02,&local_2cf9);
  m_key_name_32._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_32._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_32._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_32.field_2._8_8_ = in_RDI;
  description_38._M_string_length = in_stack_ffffffffffffd240;
  description_38._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_38.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_38.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_4b0,OBJ_DYN,m_key_name_32,description_38,inner_38,SUB81(local_2380,0))
  ;
  local_2488[0] = local_2478;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2488,"bytesrecv_per_msg","");
  local_24a8[0] = local_2498;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_24a8,"");
  local_2550[0] = local_2540;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2550,"msg","");
  std::operator+(&local_2590,
                 "The total bytes received aggregated by message type\nWhen a message type is not listed in this json object, the bytes received are 0.\nOnly known message types can appear as keys in the object and all bytes received\nof unknown message types are listed under \'"
                 ,&NET_MESSAGE_TYPE_OTHER_abi_cxx11_);
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2590,"\'.");
  local_2570 = &local_2560;
  psVar1 = (size_type *)(pbVar9->_M_dataplus)._M_p;
  paVar11 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar11) {
    local_2560 = paVar11->_M_allocated_capacity;
    uStack_2558 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_2560 = paVar11->_M_allocated_capacity;
    local_2570 = psVar1;
  }
  local_2568 = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  local_2d38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_33._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_33._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_33._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_33.field_2._8_8_ = in_RDI;
  description_39._M_string_length = in_stack_ffffffffffffd240;
  description_39._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_39.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_39.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_39.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_39.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_39.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_2530,NUM,m_key_name_33,description_39,inner_39,SUB81(local_2550,0));
  __l_03._M_len = 1;
  __l_03._M_array = &local_2530;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_2d18,__l_03,&local_2d39);
  m_key_name_34._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_34._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_34._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_34.field_2._8_8_ = in_RDI;
  description_40._M_string_length = in_stack_ffffffffffffd240;
  description_40._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_40.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_40.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_40.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_40.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_40.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_428,OBJ_DYN,m_key_name_34,description_40,inner_40,SUB81(local_2488,0))
  ;
  local_25b0[0] = local_25a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_25b0,"connection_type","");
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_2610,(util *)&CONNECTION_TYPE_DOC_abi_cxx11_,",\n");
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_2610,0,0,"Type of connection: \n",0x15);
  local_25f0._M_dataplus._M_p = (pointer)&local_25f0.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar10 = &pbVar9->field_2;
  if (paVar11 == paVar10) {
    local_25f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_25f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_25f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_25f0._M_dataplus._M_p = (pointer)paVar11;
  }
  local_25f0._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_25f0,
                      ".\nPlease note this output is unlikely to be stable in upcoming releases as we iterate to\nbest capture connection behaviors."
                     );
  local_25d0 = &local_25c0;
  psVar1 = (size_type *)(pbVar9->_M_dataplus)._M_p;
  paVar11 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar11) {
    local_25c0 = paVar11->_M_allocated_capacity;
    uStack_25b8 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_25c0 = paVar11->_M_allocated_capacity;
    local_25d0 = psVar1;
  }
  local_25c8 = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  local_2d58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_35._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_35._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_35._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_35.field_2._8_8_ = in_RDI;
  description_41._M_string_length = in_stack_ffffffffffffd240;
  description_41._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_41.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_41.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_41.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_41.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_41.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_3a0,STR,m_key_name_35,description_41,inner_41,SUB81(local_25b0,0));
  local_2630[0] = local_2620;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2630,"transport_protocol_type","")
  ;
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_2690,(util *)&TRANSPORT_TYPE_DOC_abi_cxx11_,",\n");
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_2690,0,0,"Type of transport protocol: \n",0x1d);
  local_2670._M_dataplus._M_p = (pointer)&local_2670.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar10 = &pbVar9->field_2;
  if (paVar11 == paVar10) {
    local_2670.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2670.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_2670.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2670._M_dataplus._M_p = (pointer)paVar11;
  }
  local_2670._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2670,".\n");
  local_2650 = &local_2640;
  psVar1 = (size_type *)(pbVar9->_M_dataplus)._M_p;
  paVar11 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar11) {
    local_2640 = paVar11->_M_allocated_capacity;
    uStack_2638 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_2640 = paVar11->_M_allocated_capacity;
    local_2650 = psVar1;
  }
  local_2648 = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pRVar21 = (pointer)0x0;
  pRVar19 = (pointer)0x0;
  pRVar20 = (pointer)0x0;
  m_key_name_36._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_36._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_36._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_36.field_2._8_8_ = in_RDI;
  description_42._M_string_length = in_stack_ffffffffffffd240;
  description_42._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_42.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_42.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_42.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd268;
  inner_42.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_42.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_318,STR,m_key_name_36,description_42,inner_42,SUB81(local_2630,0));
  local_26b0[0] = local_26a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_26b0,"session_id","");
  local_26d0[0] = local_26c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_26d0,
             "The session ID for this connection, or \"\" if there is none (\"v2\" transport protocol only).\n"
             ,"");
  pRVar16 = (pointer)0x0;
  pRVar17 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  m_key_name_37._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_37._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_37._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_37.field_2._8_8_ = in_RDI;
  description_43._M_string_length = in_stack_ffffffffffffd240;
  description_43._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_43.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_43.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_43.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_43.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_43.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_290,STR,m_key_name_37,description_43,inner_43,SUB81(local_26b0,0));
  __l_04._M_len = 0x28;
  __l_04._M_array = (iterator)(local_1758 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_2830,__l_04,(allocator_type *)&stack0xffffffffffffd267);
  m_key_name_38._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_38._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_38._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_38.field_2._8_8_ = in_RDI;
  description_44._M_string_length = in_stack_ffffffffffffd240;
  description_44._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_44.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_44.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_44.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar16;
  inner_44.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_44.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_1c8,OBJ,m_key_name_38,description_44,inner_44,SUB81(local_1e8,0));
  __l_05._M_len = 1;
  __l_05._M_array = &local_1c8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_2818,__l_05,(allocator_type *)&stack0xffffffffffffd266);
  m_key_name_39._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd21c;
  m_key_name_39._M_dataplus._M_p._0_4_ = uVar14;
  m_key_name_39._8_16_ = in_stack_ffffffffffffd220;
  m_key_name_39.field_2._8_8_ = in_RDI;
  description_45._M_string_length = in_stack_ffffffffffffd240;
  description_45._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd238;
  description_45.field_2._M_allocated_capacity = in_stack_ffffffffffffd248;
  description_45.field_2._8_8_ = in_stack_ffffffffffffd250;
  inner_45.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar16;
  inner_45.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd258._0_8_;
  inner_45.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd258._8_8_;
  RPCResult::RPCResult(&local_100,ARR,m_key_name_39,description_45,inner_45,SUB81(local_120,0));
  result._4_4_ = in_stack_ffffffffffffd21c;
  result.m_type = uVar14;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd220._0_8_;
  result.m_key_name._M_string_length = in_stack_ffffffffffffd220._8_8_;
  result.m_key_name.field_2._M_allocated_capacity = (size_type)in_RDI;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffd238;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd240;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd248;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd250;
  result.m_optional = (bool)in_stack_ffffffffffffd258[0];
  result.m_skip_type_check = (bool)in_stack_ffffffffffffd258[1];
  result._66_6_ = in_stack_ffffffffffffd258._2_6_;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd258._8_8_;
  result.m_description._M_string_length = (size_type)pRVar16;
  result.m_description.field_2._M_allocated_capacity = (size_type)pRVar17;
  result.m_description.field_2._8_8_ = pRVar18;
  result.m_cond._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd280;
  result.m_cond._M_string_length = (size_type)pRVar19;
  result.m_cond.field_2._M_allocated_capacity = (size_type)pRVar20;
  result.m_cond.field_2._8_8_ = pRVar21;
  RPCResults::RPCResults(&local_2800,result);
  local_2750._M_dataplus._M_p = (pointer)&local_2750.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2750,"getpeerinfo","");
  local_2770._M_dataplus._M_p = (pointer)&local_2770.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2770,"");
  HelpExampleCli(&local_2730,&local_2750,&local_2770);
  local_27b0._M_dataplus._M_p = (pointer)&local_27b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_27b0,"getpeerinfo","");
  local_27d0._M_dataplus._M_p = (pointer)&local_27d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_27d0,"");
  HelpExampleRpc(&local_2790,&local_27b0,&local_27d0);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2730._M_dataplus._M_p != &local_2730.field_2) {
    uVar12 = local_2730.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_2790._M_string_length + local_2730._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2790._M_dataplus._M_p != &local_2790.field_2) {
      uVar12 = local_2790.field_2._M_allocated_capacity;
    }
    if (local_2790._M_string_length + local_2730._M_string_length <= (ulong)uVar12) {
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_2790,0,0,local_2730._M_dataplus._M_p,local_2730._M_string_length);
      goto LAB_00a34224;
    }
  }
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_2730,local_2790._M_dataplus._M_p,local_2790._M_string_length);
LAB_00a34224:
  local_2710 = &local_2700;
  puVar2 = (ulong *)(pbVar9->_M_dataplus)._M_p;
  paVar11 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar11) {
    local_2700 = paVar11->_M_allocated_capacity;
    uStack_26f8 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_2700 = paVar11->_M_allocated_capacity;
    local_2710 = puVar2;
  }
  local_26e8 = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar9->_M_string_length = 0;
  paVar11->_M_local_buf[0] = '\0';
  if (local_2710 == &local_2700) {
    uStack_26d8 = uStack_26f8;
    local_26f0 = &local_26e0;
  }
  else {
    local_26f0 = local_2710;
  }
  local_26e0 = local_2700;
  local_2708 = 0;
  local_2700 = local_2700 & 0xffffffffffffff00;
  pcVar15 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:197:9)>
            ::_M_manager;
  name._8_16_ = in_stack_ffffffffffffd220;
  name._M_dataplus._M_p = &stack0xffffffffffffd238;
  name.field_2._8_8_ = in_RDI;
  description_46.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:197:9)>
       ::_M_manager;
  description_46._M_dataplus._M_p = (pointer)0x0;
  description_46._M_string_length = 0;
  description_46.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:197:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar16;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffd258._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffd258._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar18;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar17;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffd280;
  examples.m_examples._M_string_length = (size_type)pRVar20;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar19;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar21;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffd2a0;
  local_2710 = &local_2700;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name,description_46,args,results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar15 != (code *)0x0) {
    (*pcVar15)(&stack0xffffffffffffd238,&stack0xffffffffffffd238,3);
  }
  if (local_26f0 != &local_26e0) {
    operator_delete(local_26f0,local_26e0 + 1);
  }
  if (local_2710 != &local_2700) {
    operator_delete(local_2710,local_2700 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2790._M_dataplus._M_p != &local_2790.field_2) {
    operator_delete(local_2790._M_dataplus._M_p,local_2790.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_27d0._M_dataplus._M_p != &local_27d0.field_2) {
    operator_delete(local_27d0._M_dataplus._M_p,local_27d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_27b0._M_dataplus._M_p != &local_27b0.field_2) {
    operator_delete(local_27b0._M_dataplus._M_p,local_27b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2730._M_dataplus._M_p != &local_2730.field_2) {
    operator_delete(local_2730._M_dataplus._M_p,local_2730.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2770._M_dataplus._M_p != &local_2770.field_2) {
    operator_delete(local_2770._M_dataplus._M_p,local_2770.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2750._M_dataplus._M_p != &local_2750.field_2) {
    operator_delete(local_2750._M_dataplus._M_p,local_2750.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2800.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_cond._M_dataplus._M_p != &local_100.m_cond.field_2) {
    operator_delete(local_100.m_cond._M_dataplus._M_p,
                    local_100.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_description._M_dataplus._M_p != &local_100.m_description.field_2) {
    operator_delete(local_100.m_description._M_dataplus._M_p,
                    local_100.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_100.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_key_name._M_dataplus._M_p != &local_100.m_key_name.field_2) {
    operator_delete(local_100.m_key_name._M_dataplus._M_p,
                    local_100.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2818);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_cond._M_dataplus._M_p != &local_1c8.m_cond.field_2) {
    operator_delete(local_1c8.m_cond._M_dataplus._M_p,
                    local_1c8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_description._M_dataplus._M_p != &local_1c8.m_description.field_2) {
    operator_delete(local_1c8.m_description._M_dataplus._M_p,
                    local_1c8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_key_name._M_dataplus._M_p != &local_1c8.m_key_name.field_2) {
    operator_delete(local_1c8.m_key_name._M_dataplus._M_p,
                    local_1c8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2830);
  lVar13 = 0x1540;
  do {
    if ((long *)(local_1758 + lVar13) != *(long **)((long)local_1768 + lVar13)) {
      operator_delete(*(long **)((long)local_1768 + lVar13),*(long *)(local_1758 + lVar13) + 1);
    }
    if ((long *)((long)local_1778 + lVar13) != *(long **)((long)local_1788 + lVar13)) {
      operator_delete(*(long **)((long)local_1788 + lVar13),*(long *)((long)local_1778 + lVar13) + 1
                     );
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_17a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar13));
    if ((long *)((long)local_17b8 + lVar13) != *(long **)((long)local_17c8 + lVar13)) {
      operator_delete(*(long **)((long)local_17c8 + lVar13),*(long *)((long)local_17b8 + lVar13) + 1
                     );
    }
    lVar13 = lVar13 + -0x88;
  } while (lVar13 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd268);
  if (local_26d0[0] != local_26c0) {
    operator_delete(local_26d0[0],local_26c0[0] + 1);
  }
  if (local_26b0[0] != local_26a0) {
    operator_delete(local_26b0[0],local_26a0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd288);
  if (local_2650 != &local_2640) {
    operator_delete(local_2650,local_2640 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2670._M_dataplus._M_p != &local_2670.field_2) {
    operator_delete(local_2670._M_dataplus._M_p,local_2670.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2690._M_dataplus._M_p != &local_2690.field_2) {
    operator_delete(local_2690._M_dataplus._M_p,local_2690.field_2._M_allocated_capacity + 1);
  }
  if (local_2630[0] != local_2620) {
    operator_delete(local_2630[0],local_2620[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2d58);
  if (local_25d0 != &local_25c0) {
    operator_delete(local_25d0,local_25c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_25f0._M_dataplus._M_p != &local_25f0.field_2) {
    operator_delete(local_25f0._M_dataplus._M_p,local_25f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2610._M_dataplus._M_p != &local_2610.field_2) {
    operator_delete(local_2610._M_dataplus._M_p,local_2610.field_2._M_allocated_capacity + 1);
  }
  if (local_25b0[0] != local_25a0) {
    operator_delete(local_25b0[0],local_25a0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2d18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2530.m_cond._M_dataplus._M_p != &local_2530.m_cond.field_2) {
    operator_delete(local_2530.m_cond._M_dataplus._M_p,
                    local_2530.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2530.m_description._M_dataplus._M_p != &local_2530.m_description.field_2) {
    operator_delete(local_2530.m_description._M_dataplus._M_p,
                    local_2530.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2530.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2530.m_key_name._M_dataplus._M_p != &local_2530.m_key_name.field_2) {
    operator_delete(local_2530.m_key_name._M_dataplus._M_p,
                    local_2530.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2d38);
  if (local_2570 != &local_2560) {
    operator_delete(local_2570,local_2560 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2590._M_dataplus._M_p != &local_2590.field_2) {
    operator_delete(local_2590._M_dataplus._M_p,local_2590.field_2._M_allocated_capacity + 1);
  }
  if (local_2550[0] != local_2540) {
    operator_delete(local_2550[0],local_2540[0] + 1);
  }
  if (local_24a8[0] != local_2498) {
    operator_delete(local_24a8[0],local_2498[0] + 1);
  }
  if (local_2488[0] != local_2478) {
    operator_delete(local_2488[0],local_2478[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2ce0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2428.m_cond._M_dataplus._M_p != &local_2428.m_cond.field_2) {
    operator_delete(local_2428.m_cond._M_dataplus._M_p,
                    local_2428.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2428.m_description._M_dataplus._M_p != &local_2428.m_description.field_2) {
    operator_delete(local_2428.m_description._M_dataplus._M_p,
                    local_2428.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2428.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2428.m_key_name._M_dataplus._M_p != &local_2428.m_key_name.field_2) {
    operator_delete(local_2428.m_key_name._M_dataplus._M_p,
                    local_2428.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2cf8);
  if (local_2468[0] != local_2458) {
    operator_delete(local_2468[0],local_2458[0] + 1);
  }
  if (local_2448[0] != local_2438) {
    operator_delete(local_2448[0],local_2438[0] + 1);
  }
  if (local_23a0[0] != local_2390) {
    operator_delete(local_23a0[0],local_2390[0] + 1);
  }
  if (local_2380[0] != local_2370) {
    operator_delete(local_2380[0],local_2370[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2cc8);
  if (local_2360[0] != local_2350) {
    operator_delete(local_2360[0],local_2350[0] + 1);
  }
  if (local_2340[0] != local_2330) {
    operator_delete(local_2340[0],local_2330[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2c90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_22c0.m_cond._M_dataplus._M_p != &local_22c0.m_cond.field_2) {
    operator_delete(local_22c0.m_cond._M_dataplus._M_p,
                    local_22c0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_22c0.m_description._M_dataplus._M_p != &local_22c0.m_description.field_2) {
    operator_delete(local_22c0.m_description._M_dataplus._M_p,
                    local_22c0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_22c0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_22c0.m_key_name._M_dataplus._M_p != &local_22c0.m_key_name.field_2) {
    operator_delete(local_22c0.m_key_name._M_dataplus._M_p,
                    local_22c0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2ca8);
  if (local_2300 != &local_22f0) {
    operator_delete(local_2300,local_22f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2320._M_dataplus._M_p != &local_2320.field_2) {
    operator_delete(local_2320._M_dataplus._M_p,local_2320.field_2._M_allocated_capacity + 1);
  }
  if (local_22e0[0] != local_22d0) {
    operator_delete(local_22e0[0],local_22d0[0] + 1);
  }
  if (local_2238[0] != local_2228) {
    operator_delete(local_2238[0],local_2228[0] + 1);
  }
  if (local_2218[0] != local_2208) {
    operator_delete(local_2218[0],local_2208[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2c78);
  if (local_21f8[0] != local_21e8) {
    operator_delete(local_21f8[0],local_21e8[0] + 1);
  }
  if (local_21d8[0] != local_21c8) {
    operator_delete(local_21d8[0],local_21c8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2c58);
  if (local_21b8[0] != local_21a8) {
    operator_delete(local_21b8[0],local_21a8[0] + 1);
  }
  if (local_2198[0] != local_2188) {
    operator_delete(local_2198[0],local_2188[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2c38);
  if (local_2178[0] != local_2168) {
    operator_delete(local_2178[0],local_2168[0] + 1);
  }
  if (local_2158[0] != local_2148) {
    operator_delete(local_2158[0],local_2148[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2c00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_20f8.m_cond._M_dataplus._M_p != &local_20f8.m_cond.field_2) {
    operator_delete(local_20f8.m_cond._M_dataplus._M_p,
                    local_20f8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_20f8.m_description._M_dataplus._M_p != &local_20f8.m_description.field_2) {
    operator_delete(local_20f8.m_description._M_dataplus._M_p,
                    local_20f8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_20f8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_20f8.m_key_name._M_dataplus._M_p != &local_20f8.m_key_name.field_2) {
    operator_delete(local_20f8.m_key_name._M_dataplus._M_p,
                    local_20f8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2c18);
  if (local_2138[0] != local_2128) {
    operator_delete(local_2138[0],local_2128[0] + 1);
  }
  if (local_2118[0] != local_2108) {
    operator_delete(local_2118[0],local_2108[0] + 1);
  }
  if (local_2070[0] != local_2060) {
    operator_delete(local_2070[0],local_2060[0] + 1);
  }
  if (local_2050[0] != local_2040) {
    operator_delete(local_2050[0],local_2040[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2be8);
  if (local_2030[0] != local_2020) {
    operator_delete(local_2030[0],local_2020[0] + 1);
  }
  if (local_2010[0] != local_2000) {
    operator_delete(local_2010[0],local_2000[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2bc8);
  if (local_1ff0[0] != local_1fe0) {
    operator_delete(local_1ff0[0],local_1fe0[0] + 1);
  }
  if (local_1fd0[0] != local_1fc0) {
    operator_delete(local_1fd0[0],local_1fc0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2ba8);
  if (local_1fb0[0] != local_1fa0) {
    operator_delete(local_1fb0[0],local_1fa0[0] + 1);
  }
  if (local_1f90[0] != local_1f80) {
    operator_delete(local_1f90[0],local_1f80[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b88);
  if (local_1f70[0] != local_1f60) {
    operator_delete(local_1f70[0],local_1f60[0] + 1);
  }
  if (local_1f50[0] != local_1f40) {
    operator_delete(local_1f50[0],local_1f40[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b68);
  if (local_1f30[0] != local_1f20) {
    operator_delete(local_1f30[0],local_1f20[0] + 1);
  }
  if (local_1f10[0] != local_1f00) {
    operator_delete(local_1f10[0],local_1f00[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b48);
  if (local_1ef0[0] != local_1ee0) {
    operator_delete(local_1ef0[0],local_1ee0[0] + 1);
  }
  if (local_1ed0[0] != local_1ec0) {
    operator_delete(local_1ed0[0],local_1ec0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b28);
  if (local_1eb0[0] != local_1ea0) {
    operator_delete(local_1eb0[0],local_1ea0[0] + 1);
  }
  if (local_1e90[0] != local_1e80) {
    operator_delete(local_1e90[0],local_1e80[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b08);
  if (local_1e70[0] != local_1e60) {
    operator_delete(local_1e70[0],local_1e60[0] + 1);
  }
  if (local_1e50[0] != local_1e40) {
    operator_delete(local_1e50[0],local_1e40[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2ae8);
  if (local_1e30[0] != local_1e20) {
    operator_delete(local_1e30[0],local_1e20[0] + 1);
  }
  if (local_1e10[0] != local_1e00) {
    operator_delete(local_1e10[0],local_1e00[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2ac8);
  if (local_1df0[0] != local_1de0) {
    operator_delete(local_1df0[0],local_1de0[0] + 1);
  }
  if (local_1dd0[0] != local_1dc0) {
    operator_delete(local_1dd0[0],local_1dc0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2aa8);
  if (local_1db0[0] != local_1da0) {
    operator_delete(local_1db0[0],local_1da0[0] + 1);
  }
  if (local_1d90[0] != local_1d80) {
    operator_delete(local_1d90[0],local_1d80[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a88);
  if (local_1d70[0] != local_1d60) {
    operator_delete(local_1d70[0],local_1d60[0] + 1);
  }
  if (local_1d50[0] != local_1d40) {
    operator_delete(local_1d50[0],local_1d40[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a68);
  if (local_1d30[0] != local_1d20) {
    operator_delete(local_1d30[0],local_1d20[0] + 1);
  }
  if (local_1d10[0] != local_1d00) {
    operator_delete(local_1d10[0],local_1d00[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a48);
  if (local_1cd0 != &local_1cc0) {
    operator_delete(local_1cd0,local_1cc0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1cf0._M_dataplus._M_p != &local_1cf0.field_2) {
    operator_delete(local_1cf0._M_dataplus._M_p,local_1cf0.field_2._M_allocated_capacity + 1);
  }
  if (local_1cb0[0] != local_1ca0) {
    operator_delete(local_1cb0[0],local_1ca0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a28);
  if (local_1c90[0] != local_1c80) {
    operator_delete(local_1c90[0],local_1c80[0] + 1);
  }
  if (local_1c70[0] != local_1c60) {
    operator_delete(local_1c70[0],local_1c60[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a08);
  if (local_1c50[0] != local_1c40) {
    operator_delete(local_1c50[0],local_1c40[0] + 1);
  }
  if (local_1c30[0] != local_1c20) {
    operator_delete(local_1c30[0],local_1c20[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_29e8);
  if (local_1bf0 != &local_1be0) {
    operator_delete(local_1bf0,local_1be0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c10._M_dataplus._M_p != &local_1c10.field_2) {
    operator_delete(local_1c10._M_dataplus._M_p,local_1c10.field_2._M_allocated_capacity + 1);
  }
  if (local_1bd0[0] != local_1bc0) {
    operator_delete(local_1bd0[0],local_1bc0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_29c8);
  if (local_1b90 != &local_1b80) {
    operator_delete(local_1b90,local_1b80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1bb0._M_dataplus._M_p != &local_1bb0.field_2) {
    operator_delete(local_1bb0._M_dataplus._M_p,local_1bb0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b70[0] != local_1b60) {
    operator_delete(local_1b70[0],local_1b60[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_29a8);
  if (local_1b30 != &local_1b20) {
    operator_delete(local_1b30,local_1b20 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b50._M_dataplus._M_p != &local_1b50.field_2) {
    operator_delete(local_1b50._M_dataplus._M_p,local_1b50.field_2._M_allocated_capacity + 1);
  }
  if (local_1b10[0] != local_1b00) {
    operator_delete(local_1b10[0],local_1b00[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2988);
  if (local_1ad0 != &local_1ac0) {
    operator_delete(local_1ad0,local_1ac0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if (local_1ab0[0] != local_1aa0) {
    operator_delete(local_1ab0[0],local_1aa0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2968);
  if (local_1a90[0] != local_1a80) {
    operator_delete(local_1a90[0],local_1a80[0] + 1);
  }
  if (local_1a70[0] != local_1a60) {
    operator_delete(local_1a70[0],local_1a60[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2930);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a10.m_cond._M_dataplus._M_p != &local_1a10.m_cond.field_2) {
    operator_delete(local_1a10.m_cond._M_dataplus._M_p,
                    local_1a10.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a10.m_description._M_dataplus._M_p != &local_1a10.m_description.field_2) {
    operator_delete(local_1a10.m_description._M_dataplus._M_p,
                    local_1a10.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a10.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a10.m_key_name._M_dataplus._M_p != &local_1a10.m_key_name.field_2) {
    operator_delete(local_1a10.m_key_name._M_dataplus._M_p,
                    local_1a10.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2948);
  if (local_1a50[0] != local_1a40) {
    operator_delete(local_1a50[0],local_1a40[0] + 1);
  }
  if (local_1a30[0] != local_1a20) {
    operator_delete(local_1a30[0],local_1a20[0] + 1);
  }
  if (local_1988[0] != local_1978) {
    operator_delete(local_1988[0],local_1978[0] + 1);
  }
  if (local_1968[0] != local_1958) {
    operator_delete(local_1968[0],local_1958[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2918);
  if (local_1948[0] != local_1938) {
    operator_delete(local_1948[0],local_1938[0] + 1);
  }
  if (local_1928[0] != local_1918) {
    operator_delete(local_1928[0],local_1918[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_28f8);
  if (local_1908[0] != local_18f8) {
    operator_delete(local_1908[0],local_18f8[0] + 1);
  }
  if (local_18e8[0] != local_18d8) {
    operator_delete(local_18e8[0],local_18d8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_28d8);
  if (local_1888 != &local_1878) {
    operator_delete(local_1888,local_1878 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18a8._M_dataplus._M_p != &local_18a8.field_2) {
    operator_delete(local_18a8._M_dataplus._M_p,local_18a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18c8._M_dataplus._M_p != &local_18c8.field_2) {
    operator_delete(local_18c8._M_dataplus._M_p,local_18c8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_28c0);
  if (local_1868[0] != local_1858) {
    operator_delete(local_1868[0],local_1858[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_28a8);
  if (local_1848[0] != local_1838) {
    operator_delete(local_1848[0],local_1838[0] + 1);
  }
  if (local_1828[0] != local_1818) {
    operator_delete(local_1828[0],local_1818[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2888);
  if (local_1808[0] != local_17f8) {
    operator_delete(local_1808[0],local_17f8[0] + 1);
  }
  if (local_17e8[0] != local_17d8) {
    operator_delete(local_17e8[0],local_17d8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2868);
  if (local_17c8[0] != local_17b8) {
    operator_delete(local_17c8[0],local_17b8[0] + 1);
  }
  if (local_17a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_17a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_17a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_17a8.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2848);
  if (local_1788[0] != local_1778) {
    operator_delete(local_1788[0],local_1778[0] + 1);
  }
  if (local_1768[0] != (pointer)local_1758) {
    operator_delete(local_1768[0],local_1758._0_8_ + 1);
  }
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_27e8);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getpeerinfo()
{
    return RPCHelpMan{
        "getpeerinfo",
        "Returns data about each connected network peer as a json array of objects.",
        {},
        RPCResult{
            RPCResult::Type::ARR, "", "",
            {
                {RPCResult::Type::OBJ, "", "",
                {
                    {
                    {RPCResult::Type::NUM, "id", "Peer index"},
                    {RPCResult::Type::STR, "addr", "(host:port) The IP address and port of the peer"},
                    {RPCResult::Type::STR, "addrbind", /*optional=*/true, "(ip:port) Bind address of the connection to the peer"},
                    {RPCResult::Type::STR, "addrlocal", /*optional=*/true, "(ip:port) Local address as reported by the peer"},
                    {RPCResult::Type::STR, "network", "Network (" + Join(GetNetworkNames(/*append_unroutable=*/true), ", ") + ")"},
                    {RPCResult::Type::NUM, "mapped_as", /*optional=*/true, "The AS in the BGP route to the peer used for diversifying\n"
                                                        "peer selection (only available if the asmap config flag is set)"},
                    {RPCResult::Type::STR_HEX, "services", "The services offered"},
                    {RPCResult::Type::ARR, "servicesnames", "the services offered, in human-readable form",
                    {
                        {RPCResult::Type::STR, "SERVICE_NAME", "the service name if it is recognised"}
                    }},
                    {RPCResult::Type::BOOL, "relaytxes", "Whether we relay transactions to this peer"},
                    {RPCResult::Type::NUM_TIME, "lastsend", "The " + UNIX_EPOCH_TIME + " of the last send"},
                    {RPCResult::Type::NUM_TIME, "lastrecv", "The " + UNIX_EPOCH_TIME + " of the last receive"},
                    {RPCResult::Type::NUM_TIME, "last_transaction", "The " + UNIX_EPOCH_TIME + " of the last valid transaction received from this peer"},
                    {RPCResult::Type::NUM_TIME, "last_block", "The " + UNIX_EPOCH_TIME + " of the last block received from this peer"},
                    {RPCResult::Type::NUM, "bytessent", "The total bytes sent"},
                    {RPCResult::Type::NUM, "bytesrecv", "The total bytes received"},
                    {RPCResult::Type::NUM_TIME, "conntime", "The " + UNIX_EPOCH_TIME + " of the connection"},
                    {RPCResult::Type::NUM, "timeoffset", "The time offset in seconds"},
                    {RPCResult::Type::NUM, "pingtime", /*optional=*/true, "The last ping time in milliseconds (ms), if any"},
                    {RPCResult::Type::NUM, "minping", /*optional=*/true, "The minimum observed ping time in milliseconds (ms), if any"},
                    {RPCResult::Type::NUM, "pingwait", /*optional=*/true, "The duration in milliseconds (ms) of an outstanding ping (if non-zero)"},
                    {RPCResult::Type::NUM, "version", "The peer version, such as 70001"},
                    {RPCResult::Type::STR, "subver", "The string version"},
                    {RPCResult::Type::BOOL, "inbound", "Inbound (true) or Outbound (false)"},
                    {RPCResult::Type::BOOL, "bip152_hb_to", "Whether we selected peer as (compact blocks) high-bandwidth peer"},
                    {RPCResult::Type::BOOL, "bip152_hb_from", "Whether peer selected us as (compact blocks) high-bandwidth peer"},
                    {RPCResult::Type::NUM, "startingheight", "The starting height (block) of the peer"},
                    {RPCResult::Type::NUM, "presynced_headers", "The current height of header pre-synchronization with this peer, or -1 if no low-work sync is in progress"},
                    {RPCResult::Type::NUM, "synced_headers", "The last header we have in common with this peer"},
                    {RPCResult::Type::NUM, "synced_blocks", "The last block we have in common with this peer"},
                    {RPCResult::Type::ARR, "inflight", "",
                    {
                        {RPCResult::Type::NUM, "n", "The heights of blocks we're currently asking from this peer"},
                    }},
                    {RPCResult::Type::BOOL, "addr_relay_enabled", "Whether we participate in address relay with this peer"},
                    {RPCResult::Type::NUM, "addr_processed", "The total number of addresses processed, excluding those dropped due to rate limiting"},
                    {RPCResult::Type::NUM, "addr_rate_limited", "The total number of addresses dropped due to rate limiting"},
                    {RPCResult::Type::ARR, "permissions", "Any special permissions that have been granted to this peer",
                    {
                        {RPCResult::Type::STR, "permission_type", Join(NET_PERMISSIONS_DOC, ",\n") + ".\n"},
                    }},
                    {RPCResult::Type::NUM, "minfeefilter", "The minimum fee rate for transactions this peer accepts"},
                    {RPCResult::Type::OBJ_DYN, "bytessent_per_msg", "",
                    {
                        {RPCResult::Type::NUM, "msg", "The total bytes sent aggregated by message type\n"
                                                      "When a message type is not listed in this json object, the bytes sent are 0.\n"
                                                      "Only known message types can appear as keys in the object."}
                    }},
                    {RPCResult::Type::OBJ_DYN, "bytesrecv_per_msg", "",
                    {
                        {RPCResult::Type::NUM, "msg", "The total bytes received aggregated by message type\n"
                                                      "When a message type is not listed in this json object, the bytes received are 0.\n"
                                                      "Only known message types can appear as keys in the object and all bytes received\n"
                                                      "of unknown message types are listed under '"+NET_MESSAGE_TYPE_OTHER+"'."}
                    }},
                    {RPCResult::Type::STR, "connection_type", "Type of connection: \n" + Join(CONNECTION_TYPE_DOC, ",\n") + ".\n"
                                                              "Please note this output is unlikely to be stable in upcoming releases as we iterate to\n"
                                                              "best capture connection behaviors."},
                    {RPCResult::Type::STR, "transport_protocol_type", "Type of transport protocol: \n" + Join(TRANSPORT_TYPE_DOC, ",\n") + ".\n"},
                    {RPCResult::Type::STR, "session_id", "The session ID for this connection, or \"\" if there is none (\"v2\" transport protocol only).\n"},
                }},
            }},
        },
        RPCExamples{
            HelpExampleCli("getpeerinfo", "")
            + HelpExampleRpc("getpeerinfo", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    const CConnman& connman = EnsureConnman(node);
    const PeerManager& peerman = EnsurePeerman(node);

    std::vector<CNodeStats> vstats;
    connman.GetNodeStats(vstats);

    UniValue ret(UniValue::VARR);

    for (const CNodeStats& stats : vstats) {
        UniValue obj(UniValue::VOBJ);
        CNodeStateStats statestats;
        bool fStateStats = peerman.GetNodeStateStats(stats.nodeid, statestats);
        // GetNodeStateStats() requires the existence of a CNodeState and a Peer object
        // to succeed for this peer. These are created at connection initialisation and
        // exist for the duration of the connection - except if there is a race where the
        // peer got disconnected in between the GetNodeStats() and the GetNodeStateStats()
        // calls. In this case, the peer doesn't need to be reported here.
        if (!fStateStats) {
            continue;
        }
        obj.pushKV("id", stats.nodeid);
        obj.pushKV("addr", stats.m_addr_name);
        if (stats.addrBind.IsValid()) {
            obj.pushKV("addrbind", stats.addrBind.ToStringAddrPort());
        }
        if (!(stats.addrLocal.empty())) {
            obj.pushKV("addrlocal", stats.addrLocal);
        }
        obj.pushKV("network", GetNetworkName(stats.m_network));
        if (stats.m_mapped_as != 0) {
            obj.pushKV("mapped_as", uint64_t(stats.m_mapped_as));
        }
        ServiceFlags services{statestats.their_services};
        obj.pushKV("services", strprintf("%016x", services));
        obj.pushKV("servicesnames", GetServicesNames(services));
        obj.pushKV("relaytxes", statestats.m_relay_txs);
        obj.pushKV("lastsend", count_seconds(stats.m_last_send));
        obj.pushKV("lastrecv", count_seconds(stats.m_last_recv));
        obj.pushKV("last_transaction", count_seconds(stats.m_last_tx_time));
        obj.pushKV("last_block", count_seconds(stats.m_last_block_time));
        obj.pushKV("bytessent", stats.nSendBytes);
        obj.pushKV("bytesrecv", stats.nRecvBytes);
        obj.pushKV("conntime", count_seconds(stats.m_connected));
        obj.pushKV("timeoffset", Ticks<std::chrono::seconds>(statestats.time_offset));
        if (stats.m_last_ping_time > 0us) {
            obj.pushKV("pingtime", Ticks<SecondsDouble>(stats.m_last_ping_time));
        }
        if (stats.m_min_ping_time < std::chrono::microseconds::max()) {
            obj.pushKV("minping", Ticks<SecondsDouble>(stats.m_min_ping_time));
        }
        if (statestats.m_ping_wait > 0s) {
            obj.pushKV("pingwait", Ticks<SecondsDouble>(statestats.m_ping_wait));
        }
        obj.pushKV("version", stats.nVersion);
        // Use the sanitized form of subver here, to avoid tricksy remote peers from
        // corrupting or modifying the JSON output by putting special characters in
        // their ver message.
        obj.pushKV("subver", stats.cleanSubVer);
        obj.pushKV("inbound", stats.fInbound);
        obj.pushKV("bip152_hb_to", stats.m_bip152_highbandwidth_to);
        obj.pushKV("bip152_hb_from", stats.m_bip152_highbandwidth_from);
        obj.pushKV("startingheight", statestats.m_starting_height);
        obj.pushKV("presynced_headers", statestats.presync_height);
        obj.pushKV("synced_headers", statestats.nSyncHeight);
        obj.pushKV("synced_blocks", statestats.nCommonHeight);
        UniValue heights(UniValue::VARR);
        for (const int height : statestats.vHeightInFlight) {
            heights.push_back(height);
        }
        obj.pushKV("inflight", std::move(heights));
        obj.pushKV("addr_relay_enabled", statestats.m_addr_relay_enabled);
        obj.pushKV("addr_processed", statestats.m_addr_processed);
        obj.pushKV("addr_rate_limited", statestats.m_addr_rate_limited);
        UniValue permissions(UniValue::VARR);
        for (const auto& permission : NetPermissions::ToStrings(stats.m_permission_flags)) {
            permissions.push_back(permission);
        }
        obj.pushKV("permissions", std::move(permissions));
        obj.pushKV("minfeefilter", ValueFromAmount(statestats.m_fee_filter_received));

        UniValue sendPerMsgType(UniValue::VOBJ);
        for (const auto& i : stats.mapSendBytesPerMsgType) {
            if (i.second > 0)
                sendPerMsgType.pushKV(i.first, i.second);
        }
        obj.pushKV("bytessent_per_msg", std::move(sendPerMsgType));

        UniValue recvPerMsgType(UniValue::VOBJ);
        for (const auto& i : stats.mapRecvBytesPerMsgType) {
            if (i.second > 0)
                recvPerMsgType.pushKV(i.first, i.second);
        }
        obj.pushKV("bytesrecv_per_msg", std::move(recvPerMsgType));
        obj.pushKV("connection_type", ConnectionTypeAsString(stats.m_conn_type));
        obj.pushKV("transport_protocol_type", TransportTypeAsString(stats.m_transport_type));
        obj.pushKV("session_id", stats.m_session_id);

        ret.push_back(std::move(obj));
    }

    return ret;
},
    };
}